

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket
          (Geobucket<2UL> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  iterator __position;
  unsigned_long local_20;
  
  (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_buckets).
  super__Vector_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_buckets).
  super__Vector_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_buckets).
  super__Vector_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
  resize(&this->_buckets,1);
  local_20 = 2;
  __position._M_current =
       (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->_maxsizes,__position,&local_20);
  }
  else {
    *__position._M_current = 2;
    (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  SymDiffSplice(this,polyRight);
  return;
}

Assistant:

Geobucket(MP& polyRight)
		{
			_buckets.resize(1);
			_buckets[0].SetOrder(polyRight.GetOrder());
			_maxsizes.push_back(_d);
			SymDiffSplice(polyRight);
		}